

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

GLFWbool waitForEvent(double *timeout)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int *piVar4;
  uint64_t uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auStack_e8 [8];
  fd_set fds;
  undefined1 local_50 [8];
  timeval tv;
  
  iVar2 = *(int *)(_glfw.x11.display + 0x10);
  iVar8 = iVar2;
  if (iVar2 < _glfw.linjs.inotify) {
    iVar8 = _glfw.linjs.inotify;
  }
  iVar7 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar7 = iVar2;
  }
  tv.tv_usec = 1L << ((byte)iVar2 & 0x3f);
  do {
    while( true ) {
      fds.__fds_bits[0xd] = 0;
      fds.__fds_bits[0xe] = 0;
      fds.__fds_bits[0xb] = 0;
      fds.__fds_bits[0xc] = 0;
      fds.__fds_bits[9] = 0;
      fds.__fds_bits[10] = 0;
      fds.__fds_bits[7] = 0;
      fds.__fds_bits[8] = 0;
      fds.__fds_bits[5] = 0;
      fds.__fds_bits[6] = 0;
      fds.__fds_bits[3] = 0;
      fds.__fds_bits[4] = 0;
      fds.__fds_bits[1] = 0;
      fds.__fds_bits[2] = 0;
      auStack_e8 = (undefined1  [8])0x0;
      fds.__fds_bits[0] = 0;
      fds.__fds_bits[(long)(iVar7 >> 6) + -1] = fds.__fds_bits[(long)(iVar7 >> 6) + -1] | tv.tv_usec
      ;
      if (0 < _glfw.linjs.inotify) {
        fds.__fds_bits[(ulong)((uint)_glfw.linjs.inotify >> 6) - 1] =
             fds.__fds_bits[(ulong)((uint)_glfw.linjs.inotify >> 6) - 1] |
             1L << ((byte)_glfw.linjs.inotify & 0x3f);
      }
      if (timeout == (double *)0x0) break;
      local_50 = (undefined1  [8])(long)*timeout;
      tv.tv_sec = (__time_t)((*timeout - (double)(long)local_50) * 1000000.0);
      uVar3 = _glfwPlatformGetTimerValue();
      iVar1 = select(iVar8 + 1,(fd_set *)auStack_e8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_50)
      ;
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      uVar5 = _glfwPlatformGetTimerValue();
      lVar6 = uVar5 - uVar3;
      auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar10._0_8_ = lVar6;
      auVar10._12_4_ = 0x45300000;
      fds.__fds_bits[0xf] =
           (__fd_mask)
           ((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
      uVar3 = _glfwPlatformGetTimerFrequency();
      auVar11._8_4_ = (int)(uVar3 >> 0x20);
      auVar11._0_8_ = uVar3;
      auVar11._12_4_ = 0x45300000;
      dVar9 = *timeout -
              (double)fds.__fds_bits[0xf] /
              ((auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
      *timeout = dVar9;
      if (0 < iVar1) {
        return 1;
      }
      if (iVar2 == 4 && iVar1 == -1) {
        return 0;
      }
      if (dVar9 <= 0.0) {
        return 0;
      }
    }
    iVar2 = select(iVar8 + 1,(fd_set *)auStack_e8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    if (iVar2 != -1) {
      return 1;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  return 1;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

#if defined(__linux__)
    if (_glfw.linjs.inotify > fd)
        count = _glfw.linjs.inotify + 1;
#endif
    for (;;)
    {
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
#if defined(__linux__)
        if (_glfw.linjs.inotify > 0)
            FD_SET(_glfw.linjs.inotify, &fds);
#endif

        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}